

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s-hierarchy-decoder-CH.cc
# Opt level: O2

Expression __thiscall
RNNLanguageModel<cnn::FastLSTMBuilder>::BuildTaggingGraph
          (RNNLanguageModel<cnn::FastLSTMBuilder> *this,vector<int,_std::allocator<int>_> *sent,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *chars,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *labels,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *results,ComputationGraph *cg,double *cor,uint *predict,uint *overall,bool train)

{
  pointer *this_00;
  pointer *this_01;
  int iVar1;
  RNNBuilder *this_02;
  pointer pvVar2;
  pointer pvVar3;
  pointer pEVar4;
  int *piVar5;
  VariableIndex VVar6;
  ulong uVar7;
  Tensor *pTVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  undefined8 extraout_RDX;
  uint uVar12;
  ulong __new_size;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 extraout_var [56];
  undefined1 auVar21 [64];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 auVar22 [16];
  undefined8 in_XMM2_Qb;
  Expression EVar23;
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  undefined7 in_stack_00000021;
  char in_stack_00000028;
  vector<float,_std::allocator<float>_> dist;
  Expression oh;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> alpha_i;
  uint local_3a0;
  int bestk;
  Expression i_charpadding1;
  Expression i_charpadding_1;
  Expression i_wordpadding1;
  Expression i_wordpadding_1;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_inputw;
  initializer_list<cnn::expr::Expression> local_320;
  Expression i_l;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_input;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charw;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_char;
  Expression input_cols;
  Expression i_charpadding2;
  Expression i_charpadding_2;
  Expression i_wordpadding2;
  Expression i_wordpadding_2;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_oh;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> errs;
  Expression i_lh;
  Expression i_lhbias;
  Expression i_oh2lh;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charxExp;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_word;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charPool;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charh;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> revs;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> fwds;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_charinput;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_charSum;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charxMExp;
  Expression i_lh2l;
  Expression i_u;
  Expression oh2ohxMExp;
  Expression i_oh2ohxMExp;
  Expression i_xMExpbias;
  Expression i_word2xMExp;
  Expression i_charh2xMExp;
  Expression i_charhbias;
  Expression i_charw2charh;
  Expression i_xMExp2xExp;
  Expression combine_h;
  Expression alpha;
  
  pvVar2 = (chars->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &sent[7].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  pvVar3 = (chars->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  cnn::RNNBuilder::new_graph((RNNBuilder *)this_00,(ComputationGraph *)cor);
  dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._0_16_ =
       ZEXT816(0);
  cnn::RNNBuilder::start_new_sequence
            ((RNNBuilder *)this_00,
             (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&dist);
  std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~_Vector_base
            ((_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&dist);
  this_01 = &sent[0xf].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  cnn::RNNBuilder::new_graph((RNNBuilder *)this_01,(ComputationGraph *)cor);
  dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._0_16_ =
       ZEXT816(0);
  cnn::RNNBuilder::start_new_sequence
            ((RNNBuilder *)this_01,
             (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&dist);
  uVar16 = (long)pvVar2 - (long)pvVar3 >> 2;
  std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~_Vector_base
            ((_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&dist);
  __new_size = uVar16 & 0xffffffff;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)cg,__new_size);
  cnn::expr::parameter((ComputationGraph *)&i_wordpadding_2,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_wordpadding_1,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_wordpadding2,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_wordpadding1,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_charpadding_2,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_charpadding_1,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_charpadding2,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_charpadding1,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_charw2charh,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_charhbias,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_charh2xMExp,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_word2xMExp,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_xMExpbias,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_xMExp2xExp,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_oh2ohxMExp,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&oh2ohxMExp,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_u,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_oh2lh,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_lhbias,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&i_lh2l,(Parameters *)cor);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&i_word,__new_size,(allocator_type *)&dist);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&i_char,__new_size,(allocator_type *)&dist);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&i_charw,__new_size,(allocator_type *)&dist);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&i_charh,__new_size,(allocator_type *)&dist);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&i_charxMExp,__new_size,(allocator_type *)&dist);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&i_charxExp,__new_size,(allocator_type *)&dist);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&i_charSum,__new_size,(allocator_type *)&dist);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&i_charPool,__new_size,(allocator_type *)&dist);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&i_charinput,__new_size,(allocator_type *)&dist);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&i_input,__new_size,(allocator_type *)&dist);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&i_inputw,__new_size,(allocator_type *)&dist);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&fwds,__new_size,(allocator_type *)&dist);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&revs,__new_size,(allocator_type *)&dist);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&i_oh,__new_size,(allocator_type *)&dist);
  errs.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  errs.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x40;
  auVar20 = ZEXT1664((undefined1  [16])
                     errs.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._0_16_);
  uVar7 = uVar16 & 0xffffffff;
  for (uVar14 = 0; uVar14 != uVar7; uVar14 = uVar14 + 1) {
    cnn::expr::lookup((ComputationGraph *)&dist,(LookupParameters *)cor,
                      (uint)(sent->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start);
    i_word.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl
    .super__Vector_impl_data._M_start[uVar14].pg =
         (ComputationGraph *)
         dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start;
    i_word.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl
    .super__Vector_impl_data._M_start[uVar14].i.t =
         dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish._0_4_;
    if (::eval == false) {
      auVar20 = ZEXT464((uint)pdrop);
      cnn::expr::dropout((expr *)&dist,
                         i_word.
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar14,pdrop);
      i_word.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar14].pg =
           (ComputationGraph *)
           dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
      i_word.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar14].i.t =
           dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_finish._0_4_;
    }
    pvVar2 = (labels->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              (i_char.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar14,
               (long)*(pointer *)
                      ((long)&pvVar2[uVar14].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data + 8) -
               *(long *)&pvVar2[uVar14].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data >> 2);
    for (uVar12 = 0; uVar13 = (ulong)uVar12,
        pvVar2 = (labels->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar13 < (ulong)((long)*(pointer *)
                                ((long)&pvVar2[uVar14].super__Vector_base<int,_std::allocator<int>_>
                                        ._M_impl.super__Vector_impl_data + 8) -
                         *(long *)&pvVar2[uVar14].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data >> 2); uVar12 = uVar12 + 1) {
      cnn::expr::lookup((ComputationGraph *)&dist,(LookupParameters *)cor,
                        (uint)(sent->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish);
      pEVar4 = i_char.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar14].
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pEVar4[uVar13].pg =
           (ComputationGraph *)
           dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
      pEVar4[uVar13].i.t =
           dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_finish._0_4_;
      if (::eval == false) {
        auVar20 = ZEXT464((uint)pdrop);
        cnn::expr::dropout((expr *)&dist,
                           i_char.
                           super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar14].
                           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar13,pdrop);
        pEVar4 = i_char.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar14].
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pEVar4[uVar13].pg =
             (ComputationGraph *)
             dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start;
        pEVar4[uVar13].i.t =
             dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_finish._0_4_;
      }
    }
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              (i_charw.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar14,
               (long)i_char.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar14].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)i_char.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar14].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              (i_charh.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar14,
               (long)i_char.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar14].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)i_char.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar14].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              (i_charxMExp.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar14,
               (long)i_char.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar14].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)i_char.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar14].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              (i_charxExp.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar14,
               (long)i_char.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar14].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)i_char.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar14].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
    lVar15 = 0;
    uVar13 = 0;
    while( true ) {
      dVar18 = auVar20._0_8_;
      pEVar4 = i_char.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar14].
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar9 = (long)i_char.
                    super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar14].
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar4;
      uVar10 = lVar9 >> 4;
      if (uVar10 <= uVar13) break;
      if (lVar15 == 0) {
        if (uVar10 < 2) {
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)i_charpadding_1.pg;
          oh.i.t = 5;
          oh._12_4_ = 0;
          oh.pg = (ComputationGraph *)&dist;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
        }
        else if (lVar9 == 0x20) {
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)i_charpadding_1.pg;
          oh.i.t = 5;
          oh._12_4_ = 0;
          oh.pg = (ComputationGraph *)&dist;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
        }
        else {
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)i_charpadding_1.pg;
          oh.i.t = 5;
          oh._12_4_ = 0;
          oh.pg = (ComputationGraph *)&dist;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
        }
        pEVar4 = i_charw.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar14].
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pEVar4->pg = (ComputationGraph *)
                     CONCAT44(alpha_i.
                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              (uint)alpha_i.
                                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
        (pEVar4->i).t =
             (uint)alpha_i.
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      else if (lVar15 == 0x10) {
        if (uVar10 < 3) {
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)pEVar4->pg;
          oh.i.t = 5;
          oh._12_4_ = 0;
          oh.pg = (ComputationGraph *)&dist;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
        }
        else if (lVar9 == 0x30) {
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)pEVar4->pg;
          oh.i.t = 5;
          oh._12_4_ = 0;
          oh.pg = (ComputationGraph *)&dist;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
        }
        else {
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)pEVar4->pg;
          oh.i.t = 5;
          oh._12_4_ = 0;
          oh.pg = (ComputationGraph *)&dist;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
        }
        pEVar4 = i_charw.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar14].
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pEVar4[1].pg = (ComputationGraph *)
                       CONCAT44(alpha_i.
                                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                (uint)alpha_i.
                                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
        pEVar4[1].i.t =
             (uint)alpha_i.
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        if (uVar13 + 1 < uVar10) {
          if (uVar13 + 2 < uVar10) {
            dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_finish._0_4_ = *(undefined4 *)((long)pEVar4 + lVar15 + -0x18);
            dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start = *(pointer *)((long)&pEVar4[-2].pg + lVar15);
            dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = *(pointer *)((long)&pEVar4[-1].pg + lVar15);
            oh.i.t = 5;
            oh._12_4_ = 0;
            oh.pg = (ComputationGraph *)&dist;
            cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                      ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
          }
          else {
            dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_finish._0_4_ = *(undefined4 *)((long)pEVar4 + lVar15 + -0x18);
            dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start = *(pointer *)((long)&pEVar4[-2].pg + lVar15);
            dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = *(pointer *)((long)&pEVar4[-1].pg + lVar15);
            oh.i.t = 5;
            oh._12_4_ = 0;
            oh.pg = (ComputationGraph *)&dist;
            cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                      ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
          }
        }
        else {
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish._0_4_ = *(undefined4 *)((long)pEVar4 + lVar15 + -0x18);
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start = *(pointer *)((long)&pEVar4[-2].pg + lVar15);
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = *(pointer *)((long)&pEVar4[-1].pg + lVar15);
          oh.i.t = 5;
          oh._12_4_ = 0;
          oh.pg = (ComputationGraph *)&dist;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
        }
        pEVar4 = i_charw.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar14].
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)&pEVar4->pg + lVar15) =
             CONCAT44(alpha_i.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                      (uint)alpha_i.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start);
        *(uint *)((long)&(pEVar4->i).t + lVar15) =
             (uint)alpha_i.
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)i_charw2charh.pg;
      input_cols.i.t = 3;
      input_cols._12_4_ = 0;
      input_cols.pg = (ComputationGraph *)&dist;
      cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&oh,(initializer_list<cnn::expr::Expression> *)&input_cols);
      dVar18 = cnn::expr::tanh((expr *)&alpha_i,dVar18);
      pEVar4 = i_charh.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar14].
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)&pEVar4->pg + lVar15) =
           CONCAT44(alpha_i.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                    (uint)alpha_i.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      *(uint *)((long)&(pEVar4->i).t + lVar15) =
           (uint)alpha_i.
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = i_xMExpbias.i.t;
      dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)i_xMExpbias.pg;
      dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)i_charh2xMExp.pg;
      input_cols.i.t = 5;
      input_cols._12_4_ = 0;
      input_cols.pg = (ComputationGraph *)&dist;
      cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&oh,(initializer_list<cnn::expr::Expression> *)&input_cols);
      dVar18 = cnn::expr::tanh((expr *)&alpha_i,dVar18);
      pEVar4 = i_charxMExp.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar14].
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)&pEVar4->pg + lVar15) =
           CONCAT44(alpha_i.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                    (uint)alpha_i.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      *(uint *)((long)&(pEVar4->i).t + lVar15) =
           (uint)alpha_i.
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      cnn::expr::operator*
                ((expr *)&alpha_i,&i_xMExp2xExp,
                 (Expression *)
                 ((long)&(i_charxMExp.
                          super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar14].
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start)->pg + lVar15));
      auVar20._0_8_ = cnn::expr::exp((expr *)&dist,dVar18);
      auVar20._8_56_ = extraout_var;
      uVar13 = uVar13 + 1;
      pEVar4 = i_charxExp.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar14].
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(pointer *)((long)&pEVar4->pg + lVar15) =
           dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
      *(uint *)((long)&(pEVar4->i).t + lVar15) =
           dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_finish._0_4_;
      lVar15 = lVar15 + 0x10;
    }
    cnn::expr::detail::
    f<cnn::Sum,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
              ((detail *)&dist,
               i_charxExp.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar14);
    i_charSum.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar14].pg =
         (ComputationGraph *)
         dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start;
    i_charSum.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar14].i.t =
         dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish._0_4_;
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              (i_charPool.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar14,
               (long)i_char.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar14].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)i_char.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar14].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
    for (uVar12 = 0; uVar13 = (ulong)uVar12,
        uVar13 < (ulong)((long)i_char.
                               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar14].
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)i_char.
                               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar14].
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4); uVar12 = uVar12 + 1)
    {
      pEVar4 = i_charh.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar14].
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_start;
      cnn::expr::cdiv((expr *)&alpha_i,
                      i_charxExp.
                      super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar14].
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar13,
                      i_charSum.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar14);
      cnn::expr::cwise_multiply((expr *)&dist,pEVar4 + uVar13,(Expression *)&alpha_i);
      pEVar4 = i_charPool.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar14].
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pEVar4[uVar13].pg =
           (ComputationGraph *)
           dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
      pEVar4[uVar13].i.t =
           dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_finish._0_4_;
    }
    cnn::expr::detail::
    f<cnn::Sum,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
              ((detail *)&dist,
               i_charPool.
               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar14);
    i_charinput.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar14].pg =
         (ComputationGraph *)
         dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start;
    i_charinput.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar14].i.t =
         dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish._0_4_;
  }
  lVar9 = uVar7 << 4;
  for (lVar15 = 0; lVar9 != lVar15; lVar15 = lVar15 + 0x10) {
    dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
    ._0_4_ = *(undefined4 *)
              ((long)&((i_charinput.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar15);
    dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
         = *(pointer *)
            ((long)&(i_charinput.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start)->pg + lVar15);
    dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         *(pointer *)
          ((long)&(i_word.
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start)->pg + lVar15);
    oh.i.t = 2;
    oh._12_4_ = 0;
    oh.pg = (ComputationGraph *)&dist;
    cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
              ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
    *(ulong *)((long)&(i_input.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start)->pg + lVar15) =
         CONCAT44(alpha_i.
                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                  (uint)alpha_i.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    *(uint *)((long)&((i_input.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar15) =
         (uint)alpha_i.
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  }
  uVar14 = 2;
  for (lVar15 = 0; lVar9 != lVar15; lVar15 = lVar15 + 0x10) {
    local_3a0 = (uint)uVar16;
    if (lVar15 == 0) {
      if (local_3a0 < 2) {
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = i_wordpadding_2.i.t;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)i_wordpadding_2.pg;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)i_wordpadding_1.pg;
        oh.i.t = 5;
        oh._12_4_ = 0;
        oh.pg = (ComputationGraph *)&dist;
        cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
      }
      else if (local_3a0 == 2) {
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = i_wordpadding_2.i.t;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)i_wordpadding_2.pg;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)i_wordpadding_1.pg;
        oh.i.t = 5;
        oh._12_4_ = 0;
        oh.pg = (ComputationGraph *)&dist;
        cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
      }
      else {
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = i_wordpadding_2.i.t;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)i_wordpadding_2.pg;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)i_wordpadding_1.pg;
        oh.i.t = 5;
        oh._12_4_ = 0;
        oh.pg = (ComputationGraph *)&dist;
        cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
      }
      (i_inputw.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
       _M_impl.super__Vector_impl_data._M_start)->pg =
           (ComputationGraph *)
           CONCAT44(alpha_i.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                    (uint)alpha_i.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      ((i_inputw.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
        _M_impl.super__Vector_impl_data._M_start)->i).t =
           (uint)alpha_i.
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    }
    else if (lVar15 == 0x10) {
      if (local_3a0 < 3) {
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = i_wordpadding_1.i.t;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)i_wordpadding_1.pg;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (pointer)(i_input.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start)->pg;
        oh.i.t = 5;
        oh._12_4_ = 0;
        oh.pg = (ComputationGraph *)&dist;
        cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
      }
      else if (local_3a0 < 4) {
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = i_wordpadding_1.i.t;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)i_wordpadding_1.pg;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (pointer)(i_input.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start)->pg;
        oh.i.t = 5;
        oh._12_4_ = 0;
        oh.pg = (ComputationGraph *)&dist;
        cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
      }
      else {
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = i_wordpadding_1.i.t;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)i_wordpadding_1.pg;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (pointer)(i_input.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start)->pg;
        oh.i.t = 5;
        oh._12_4_ = 0;
        oh.pg = (ComputationGraph *)&dist;
        cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
      }
      i_inputw.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start[1].pg =
           (ComputationGraph *)
           CONCAT44(alpha_i.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                    (uint)alpha_i.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      i_inputw.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start[1].i.t =
           (uint)alpha_i.
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (uVar14 - 1 < uVar7) {
        if (uVar14 < uVar7) {
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish._0_4_ =
               *(undefined4 *)
                ((long)i_input.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar15 + -0x18);
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start = *(pointer *)
                      ((long)&i_input.
                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start[-2].pg + lVar15);
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage =
               *(pointer *)
                ((long)&i_input.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1].pg + lVar15);
          oh.i.t = 5;
          oh._12_4_ = 0;
          oh.pg = (ComputationGraph *)&dist;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
        }
        else {
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish._0_4_ =
               *(undefined4 *)
                ((long)i_input.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar15 + -0x18);
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start = *(pointer *)
                      ((long)&i_input.
                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start[-2].pg + lVar15);
          dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage =
               *(pointer *)
                ((long)&i_input.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1].pg + lVar15);
          oh.i.t = 5;
          oh._12_4_ = 0;
          oh.pg = (ComputationGraph *)&dist;
          cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
        }
      }
      else {
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ =
             *(undefined4 *)
              ((long)i_input.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar15 + -0x18);
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = *(pointer *)
                    ((long)&i_input.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start[-2].pg + lVar15);
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             *(pointer *)
              ((long)&i_input.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].pg + lVar15);
        oh.i.t = 5;
        oh._12_4_ = 0;
        oh.pg = (ComputationGraph *)&dist;
        cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
      }
      *(ulong *)((long)&(i_inputw.
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_start)->pg + lVar15) =
           CONCAT44(alpha_i.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                    (uint)alpha_i.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      *(uint *)((long)&((i_inputw.
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar15) =
           (uint)alpha_i.
                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    }
    uVar14 = uVar14 + 1;
  }
  for (lVar15 = 0; uVar14 = uVar7, lVar9 != lVar15; lVar15 = lVar15 + 0x10) {
    cnn::RNNBuilder::add_input((RNNBuilder *)&dist,(Expression *)this_00);
    *(pointer *)
     ((long)&(fwds.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
              ._M_impl.super__Vector_impl_data._M_start)->pg + lVar15) =
         dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start;
    *(uint *)((long)&((fwds.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar15) =
         dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish._0_4_;
  }
  while( true ) {
    uVar16 = uVar16 - 1;
    if (uVar14 == 0) break;
    cnn::RNNBuilder::add_input((RNNBuilder *)&dist,(Expression *)this_01);
    revs.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl.
    super__Vector_impl_data._M_start[uVar16 & 0xffffffff].pg =
         (ComputationGraph *)
         dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start;
    revs.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl.
    super__Vector_impl_data._M_start[uVar16 & 0xffffffff].i.t =
         dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish._0_4_;
    uVar14 = uVar14 - 1;
  }
  for (lVar15 = 0; lVar9 != lVar15; lVar15 = lVar15 + 0x10) {
    dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
    ._0_4_ = *(undefined4 *)
              ((long)&((fwds.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar15);
    dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
         = *(pointer *)
            ((long)&(fwds.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start)->pg + lVar15);
    dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         *(pointer *)
          ((long)&(revs.
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start)->pg + lVar15);
    oh.i.t = 2;
    oh._12_4_ = 0;
    oh.pg = (ComputationGraph *)&dist;
    cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
              ((detail *)&alpha_i,(initializer_list<cnn::expr::Expression> *)&oh);
    *(ulong *)((long)&(i_oh.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start)->pg + lVar15) =
         CONCAT44(alpha_i.
                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                  (uint)alpha_i.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    *(uint *)((long)&((i_oh.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar15) =
         (uint)alpha_i.
               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  }
  this_02 = (RNNBuilder *)(sent + 0x18);
  uVar16 = 0;
  do {
    if (uVar16 == uVar7) {
      cnn::expr::detail::
      f<cnn::Sum,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                ((detail *)this,&errs);
      std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
      ~_Vector_base(&errs.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   );
      std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
      ~_Vector_base(&i_oh.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   );
      std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
      ~_Vector_base(&revs.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   );
      std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
      ~_Vector_base(&fwds.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   );
      std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
      ~_Vector_base(&i_inputw.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   );
      std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
      ~_Vector_base(&i_input.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   );
      std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
      ~_Vector_base(&i_charinput.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   );
      std::
      vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
      ::~vector(&i_charPool);
      std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
      ~_Vector_base(&i_charSum.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   );
      std::
      vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
      ::~vector(&i_charxExp);
      std::
      vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
      ::~vector(&i_charxMExp);
      std::
      vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
      ::~vector(&i_charh);
      std::
      vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
      ::~vector(&i_charw);
      std::
      vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
      ::~vector(&i_char);
      std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
      ~_Vector_base(&i_word.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   );
      EVar23._8_8_ = extraout_RDX;
      EVar23.pg = (ComputationGraph *)this;
      return EVar23;
    }
    cnn::RNNBuilder::new_graph(this_02,(ComputationGraph *)cor);
    dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._0_16_ =
         ZEXT816(0) << 0x40;
    auVar21 = ZEXT1664((undefined1  [16])
                       dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._0_16_);
    cnn::RNNBuilder::start_new_sequence
              (this_02,(vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                       &dist);
    std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~_Vector_base
              ((_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&dist)
    ;
    if (in_stack_00000028 == '\0') {
      alpha_i.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = HIDDEN_DIM;
      x_00._M_len = 1;
      x_00._M_array = (iterator)&alpha_i;
      cnn::Dim::Dim((Dim *)&dist,x_00);
      cnn::expr::zeroes((ComputationGraph *)&oh,(Dim *)cor);
      iVar1 = 0;
      do {
        if (6 < iVar1) break;
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
                  (&alpha_i,__new_size,(allocator_type *)&dist);
        for (lVar15 = 0; dVar18 = auVar21._0_8_, lVar9 != lVar15; lVar15 = lVar15 + 0x10) {
          cnn::expr::operator*
                    ((expr *)&combine_h,&i_oh2ohxMExp,
                     (Expression *)
                     ((long)&(i_oh.
                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start)->pg + lVar15));
          cnn::expr::operator*((expr *)&i_lh,&oh2ohxMExp,&oh);
          cnn::expr::operator+((expr *)&alpha,&combine_h,&i_lh);
          auVar21._0_8_ = cnn::expr::tanh((expr *)&input_cols,dVar18);
          auVar21._8_56_ = extraout_var_02;
          cnn::expr::operator*((expr *)&dist,&i_u,&input_cols);
          *(pointer *)
           (CONCAT44(alpha_i.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                     (uint)alpha_i.
                           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                           ._M_impl.super__Vector_impl_data._M_start) + lVar15) =
               dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
          *(uint *)(CONCAT44(alpha_i.
                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             (uint)alpha_i.
                                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                   ._M_impl.super__Vector_impl_data._M_start) + 8 + lVar15) =
               dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish._0_4_;
        }
        cnn::expr::detail::
        f<cnn::ConcatenateColumns,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                  ((detail *)&input_cols,&i_oh);
        cnn::expr::detail::
        f<cnn::Concatenate,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                  ((detail *)&dist,&alpha_i);
        cnn::expr::softmax((expr *)&alpha,(Expression *)&dist);
        cnn::expr::transpose((expr *)&i_lh,&alpha);
        cnn::expr::transpose((expr *)&i_l,&input_cols);
        cnn::expr::operator*((expr *)&combine_h,&i_lh,&i_l);
        cnn::expr::transpose((expr *)&dist,&combine_h);
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start;
        i_lh.i.t = 2;
        i_lh._12_4_ = 0;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ =
             i_oh.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar16].i.t;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)i_oh.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar16].pg;
        i_lh.pg = (ComputationGraph *)&dist;
        cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&combine_h,(initializer_list<cnn::expr::Expression> *)&i_lh);
        cnn::RNNBuilder::add_input((RNNBuilder *)&dist,(Expression *)this_02);
        VVar6.t = dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish._0_4_;
        local_320._M_len = 3;
        oh.pg = (ComputationGraph *)
                dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = i_lhbias.i.t;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)i_lhbias.pg;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)i_oh2lh.pg;
        oh.i.t = VVar6.t;
        local_320._M_array = (iterator)&dist;
        cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&i_l,&local_320);
        auVar21._0_8_ = cnn::expr::tanh((expr *)&i_lh,dVar18);
        auVar21._8_56_ = extraout_var_03;
        cnn::expr::operator*((expr *)&i_l,&i_lh2l,&i_lh);
        if (predict == (uint *)0x0) {
          bVar17 = true;
        }
        else {
          pTVar8 = cnn::ComputationGraph::incremental_forward((ComputationGraph *)cor);
          cnn::as_vector(&dist,pTVar8);
          auVar21 = ZEXT1664(ZEXT816(0xd4b075823b6c498a));
          bestk = -1;
          for (lVar15 = 0;
              (long)dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2 != lVar15; lVar15 = lVar15 + 1) {
            if (auVar21._0_8_ <
                (double)dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar15]) {
              auVar21 = ZEXT1664(CONCAT88(in_XMM2_Qb,
                                          (double)dist.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[lVar15]))
              ;
              bestk = (int)lVar15;
            }
          }
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     ((cg->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar16 * 3),&bestk);
          pvVar2 = (results->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar15 = *(long *)&pvVar2[uVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data;
          lVar11 = (long)*(pointer *)
                          ((long)&pvVar2[uVar16].super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data + 8) - lVar15;
          if ((ulong)(long)iVar1 < (ulong)(lVar11 >> 2)) {
            uVar12 = *(uint *)(lVar15 + (long)iVar1 * 4);
            if (uVar12 == bestk) {
              auVar21 = ZEXT864((ulong)(*(double *)predict + 1.0));
              *(double *)predict = *(double *)predict + 1.0;
            }
            cnn::expr::pickneglogsoftmax((expr *)&local_320,&i_l,uVar12);
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
            emplace_back<cnn::expr::Expression>(&errs,(Expression *)&local_320);
          }
          else {
            cnn::expr::pickneglogsoftmax((expr *)&local_320,&i_l,*(uint *)(lVar15 + -4 + lVar11));
            std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
            emplace_back<cnn::expr::Expression>(&errs,(Expression *)&local_320);
          }
          iVar1 = iVar1 + 1;
          bVar17 = bestk != endlabel;
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    (&dist.super__Vector_base<float,_std::allocator<float>_>);
        }
        std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
        ~_Vector_base(&alpha_i.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     );
      } while (bVar17);
      if (overall != (uint *)0x0) {
        *overall = *overall + iVar1;
      }
      piVar5 = (int *)CONCAT71(in_stack_00000021,train);
      if (piVar5 != (int *)0x0) {
        pvVar2 = (results->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *piVar5 = *piVar5 + (int)((ulong)((long)*(pointer *)
                                                 ((long)&pvVar2[uVar16].
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data + 8) -
                                         *(long *)&pvVar2[uVar16].
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data) >> 2);
      }
    }
    else {
      alpha_i.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = HIDDEN_DIM;
      x._M_len = 1;
      x._M_array = (iterator)&alpha_i;
      cnn::Dim::Dim((Dim *)&dist,x);
      cnn::expr::zeroes((ComputationGraph *)&oh,(Dim *)cor);
      iVar1 = 0;
      while( true ) {
        pvVar2 = (results->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar14 = (long)*(pointer *)
                        ((long)&pvVar2[uVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data + 8) -
                 *(long *)&pvVar2[uVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data >> 2;
        if (uVar14 <= (ulong)(long)iVar1) break;
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
                  (&alpha_i,__new_size,(allocator_type *)&dist);
        for (lVar15 = 0; dVar18 = auVar21._0_8_, lVar9 != lVar15; lVar15 = lVar15 + 0x10) {
          cnn::expr::operator*
                    ((expr *)&combine_h,&i_oh2ohxMExp,
                     (Expression *)
                     ((long)&(i_oh.
                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start)->pg + lVar15));
          cnn::expr::operator*((expr *)&i_lh,&oh2ohxMExp,&oh);
          cnn::expr::operator+((expr *)&alpha,&combine_h,&i_lh);
          auVar21._0_8_ = cnn::expr::tanh((expr *)&input_cols,dVar18);
          auVar21._8_56_ = extraout_var_00;
          cnn::expr::operator*((expr *)&dist,&i_u,&input_cols);
          *(pointer *)
           (CONCAT44(alpha_i.
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                     (uint)alpha_i.
                           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                           ._M_impl.super__Vector_impl_data._M_start) + lVar15) =
               dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
          *(uint *)(CONCAT44(alpha_i.
                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             (uint)alpha_i.
                                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                   ._M_impl.super__Vector_impl_data._M_start) + 8 + lVar15) =
               dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish._0_4_;
        }
        cnn::expr::detail::
        f<cnn::ConcatenateColumns,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                  ((detail *)&input_cols,&i_oh);
        cnn::expr::detail::
        f<cnn::Concatenate,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                  ((detail *)&dist,&alpha_i);
        cnn::expr::softmax((expr *)&alpha,(Expression *)&dist);
        cnn::expr::transpose((expr *)&i_lh,&alpha);
        cnn::expr::transpose((expr *)&i_l,&input_cols);
        cnn::expr::operator*((expr *)&combine_h,&i_lh,&i_l);
        cnn::expr::transpose((expr *)&dist,&combine_h);
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start;
        i_lh.i.t = 2;
        i_lh._12_4_ = 0;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ =
             i_oh.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar16].i.t;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)i_oh.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar16].pg;
        i_lh.pg = (ComputationGraph *)&dist;
        cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&combine_h,(initializer_list<cnn::expr::Expression> *)&i_lh);
        cnn::RNNBuilder::add_input((RNNBuilder *)&dist,(Expression *)this_02);
        VVar6.t = dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish._0_4_;
        local_320._M_len = 3;
        oh.pg = (ComputationGraph *)
                dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = i_lhbias.i.t;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)i_lhbias.pg;
        dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)i_oh2lh.pg;
        oh.i.t = VVar6.t;
        local_320._M_array = (iterator)&dist;
        cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)&i_l,&local_320);
        auVar21._0_8_ = cnn::expr::tanh((expr *)&i_lh,dVar18);
        auVar21._8_56_ = extraout_var_01;
        cnn::expr::operator*((expr *)&i_l,&i_lh2l,&i_lh);
        if (predict != (uint *)0x0) {
          pTVar8 = cnn::ComputationGraph::incremental_forward((ComputationGraph *)cor);
          cnn::as_vector(&dist,pTVar8);
          auVar19 = ZEXT816(0xd4b075823b6c498a);
          uVar14 = 0xffffffffffffffff;
          for (uVar13 = 0; auVar21 = ZEXT1664(auVar19),
              (long)dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2 != uVar13; uVar13 = uVar13 + 1) {
            auVar22._0_8_ =
                 (double)dist.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar13];
            auVar22._8_8_ = in_XMM2_Qb;
            dVar18 = auVar19._0_8_;
            auVar19 = vmaxsd_avx(auVar22,auVar19);
            if (dVar18 < auVar22._0_8_) {
              uVar14 = uVar13;
            }
            uVar14 = uVar14 & 0xffffffff;
          }
          uVar12 = *(uint *)(*(long *)&(results->
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start[uVar16].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data + (long)iVar1 * 4);
          if (uVar12 == (uint)uVar14) {
            auVar21 = ZEXT864((ulong)(*(double *)predict + 1.0));
            *(double *)predict = *(double *)predict + 1.0;
          }
          cnn::expr::pickneglogsoftmax((expr *)&local_320,&i_l,uVar12);
          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
          emplace_back<cnn::expr::Expression>(&errs,(Expression *)&local_320);
          iVar1 = iVar1 + 1;
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    (&dist.super__Vector_base<float,_std::allocator<float>_>);
        }
        std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
        ~_Vector_base(&alpha_i.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     );
      }
      if (overall != (uint *)0x0) {
        *overall = *overall + iVar1;
      }
      piVar5 = (int *)CONCAT71(in_stack_00000021,train);
      if (piVar5 != (int *)0x0) {
        *piVar5 = *piVar5 + (int)uVar14;
      }
    }
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

Expression BuildTaggingGraph(const vector<int>& sent, const vector< vector<int> >& chars, const vector< vector<int> >& labels,  vector< vector<int> >& results, ComputationGraph& cg, double* cor = 0, unsigned* predict = 0, unsigned* overall = 0, bool train=true) {
    const unsigned slen = sent.size();
    l2rbuilder.new_graph(cg);  // reset RNN builder for new graph
    l2rbuilder.start_new_sequence();
    r2lbuilder.new_graph(cg);  // reset RNN builder for new graph
    r2lbuilder.start_new_sequence();
    results.resize(slen);

    Expression i_wordpadding_2 = parameter(cg, p_wordpadding_2);
    Expression i_wordpadding_1 = parameter(cg, p_wordpadding_1);
    Expression i_wordpadding2 = parameter(cg, p_wordpadding2);
    Expression i_wordpadding1 = parameter(cg, p_wordpadding1);

    Expression i_charpadding_2 = parameter(cg, p_charpadding_2);
    Expression i_charpadding_1 = parameter(cg, p_charpadding_1);
    Expression i_charpadding2 = parameter(cg, p_charpadding2);
    Expression i_charpadding1 = parameter(cg, p_charpadding1);
  
    Expression i_charw2charh = parameter(cg, p_charw2charh);
    Expression i_charhbias = parameter(cg, p_charhbias);
    //attention pooling
    Expression i_charh2xMExp = parameter(cg, p_charh2xMExp);
    Expression i_word2xMExp = parameter(cg, p_word2xMExp);
    Expression i_xMExpbias = parameter(cg, p_xMExpbias);
    Expression i_xMExp2xExp = parameter(cg, p_xMExp2xExp);
    //
    
    // Expression i_l2oh = parameter(cg, p_l2oh);
    // Expression i_r2oh = parameter(cg, p_r2oh);
    // Expression i_ohbias = parameter(cg, p_ohbias);

    //attention labeling
    Expression i_oh2ohxMExp = parameter(cg, p_oh2ohxMExp);
    Expression oh2ohxMExp = parameter(cg, p_osh2ohxMExp);
    Expression i_u = parameter(cg, p_u);

    Expression i_oh2lh = parameter(cg, p_oh2lh);
    Expression i_lhbias = parameter(cg, p_lhbias);

    Expression i_lh2l = parameter(cg, p_lh2l);

    vector<Expression> i_word(slen);

    vector< vector<Expression> > i_char(slen);
    vector< vector<Expression> > i_charw(slen);
    vector< vector<Expression> > i_charh(slen);
    //attention pooling
    vector< vector<Expression> > i_charxMExp(slen);
    vector< vector<Expression> > i_charxExp(slen);
    vector< Expression > i_charSum(slen);
    vector< vector<Expression> > i_charPool(slen);
    vector< Expression > i_charinput(slen);
    //

    vector< Expression > i_input(slen);
    vector< Expression > i_inputw(slen);

    vector<Expression> fwds(slen);
    vector<Expression> revs(slen);
    vector<Expression> i_oh(slen);

    vector<Expression> errs; 
    for (unsigned i = 0; i < slen; ++i) {
      i_word[i] = lookup(cg, p_w, sent[i]);
      if (!eval) { i_word[i] = dropout(i_word[i], pdrop); }
      i_char[i].resize(chars[i].size());
      for (unsigned j = 0; j < chars[i].size(); ++j) {
        i_char[i][j] = lookup(cg, p_c, chars[i][j]);
        if (!eval) { i_char[i][j] = dropout(i_char[i][j], pdrop); }
      }
//      cerr<<"lookup done"<<endl;
      i_charw[i].resize(i_char[i].size());
      i_charh[i].resize(i_char[i].size());
      i_charxMExp[i].resize(i_char[i].size());
      i_charxExp[i].resize(i_char[i].size());
      for (int j = 0; j < i_char[i].size(); ++j) {
        if ( j-1 < 0){
	  if ( j+1 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_2, i_charpadding_1, i_char[i][j], i_charpadding1, i_charpadding2});
	  else if ( j+2 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_2, i_charpadding_1, i_char[i][j], i_char[i][j+1], i_charpadding1});
	  else
	    i_charw[i][j] = concatenate({i_charpadding_2, i_charpadding_1, i_char[i][j], i_char[i][j+1], i_char[i][j+2]});
  	}
	else if ( j-2 < 0){
	  if ( j+1 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_1, i_char[i][j-1], i_char[i][j], i_charpadding1, i_charpadding2});
    	  else if ( j+2 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_1, i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_charpadding1});
	  else
	    i_charw[i][j] = concatenate({i_charpadding_1, i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_char[i][j+2]});
        }
  	else{
	  if ( j+1 >= i_char[i].size())
            i_charw[i][j] = concatenate({i_char[i][j-2], i_char[i][j-1], i_char[i][j], i_charpadding1, i_charpadding2});
          else if ( j+2 >= i_char[i].size())
            i_charw[i][j] = concatenate({i_char[i][j-2], i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_charpadding1});
          else 
            i_charw[i][j] = concatenate({i_char[i][j-2], i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_char[i][j+2]});
	}
	i_charh[i][j] = tanh(affine_transform({i_charhbias, i_charw2charh ,i_charw[i][j]}));
	i_charxMExp[i][j] = tanh(affine_transform({i_xMExpbias, i_charh2xMExp, i_charh[i][j], i_word2xMExp, i_word[i]}));
	i_charxExp[i][j] = exp(i_xMExp2xExp * i_charxMExp[i][j]);
      }
      i_charSum[i] = sum(i_charxExp[i]);
      i_charPool[i].resize(i_char[i].size());
      for (unsigned j = 0; j < i_char[i].size(); ++j){
        i_charPool[i][j] = cwise_multiply(i_charh[i][j], cdiv(i_charxExp[i][j], i_charSum[i]));
      }
      i_charinput[i] = sum(i_charPool[i]);
    }
//    cerr<<"input done"<<endl;
    for (unsigned i = 0; i < slen; ++i) {
      i_input[i] = concatenate({i_charinput[i], i_word[i]});
    }
//    cerr<<"concatenate done"<<endl;
    for (int i = 0; i < slen; ++i) {
      if(i-1 < 0){
        if(i+1>= slen){
	  i_inputw[i] = concatenate({i_wordpadding_2, i_wordpadding_1, i_input[i], i_wordpadding1, i_wordpadding2});
	}
   	else if(i+2>=slen){
	  i_inputw[i] = concatenate({i_wordpadding_2, i_wordpadding_1, i_input[i], i_input[i+1], i_wordpadding1});
	}
 	else{
 	  i_inputw[i] = concatenate({i_wordpadding_2, i_wordpadding_1, i_input[i], i_input[i+1], i_input[i+2]});
	}
      }
      else if(i-2<0){
        if(i+1>= slen){
          i_inputw[i] = concatenate({i_wordpadding_1, i_input[i-1], i_input[i], i_wordpadding1, i_wordpadding2});
        }
        else if(i+2>=slen){
          i_inputw[i] = concatenate({i_wordpadding_1, i_input[i-1], i_input[i], i_input[i+1], i_wordpadding1});
        }
        else{
          i_inputw[i] = concatenate({i_wordpadding_1, i_input[i-1], i_input[i], i_input[i+1], i_input[i+2]});
        }
      }
      else{
        if(i+1>= slen){
          i_inputw[i] = concatenate({i_input[i-2], i_input[i-1], i_input[i], i_wordpadding1, i_wordpadding2});
        }
        else if(i+2>=slen){
          i_inputw[i] = concatenate({i_input[i-2], i_input[i-1], i_input[i], i_input[i+1], i_wordpadding1});
        }
        else{
          i_inputw[i] = concatenate({i_input[i-2], i_input[i-1], i_input[i], i_input[i+1], i_input[i+2]});
        }
      }
    }
//    cerr<<"intput windows done "<<INPUT_WINDOWS_DIM<<endl;
    for (unsigned i = 0; i < slen; ++i)
      fwds[i] = l2rbuilder.add_input(i_inputw[i]);
    for (unsigned i = 0; i < slen; ++i)
      revs[slen - i - 1] = r2lbuilder.add_input(i_inputw[slen - i - 1]);   
//    cerr<<"lstm done"<<endl;
    for (unsigned i = 0; i < slen; ++i)
      //i_oh[i] = tanh(affine_transform({i_ohbias, i_l2oh, fwds[i], i_r2oh, revs[i]}));
        i_oh[i] = concatenate({fwds[i], revs[i]});

    for (unsigned i = 0; i < slen; ++i) {
   //   cerr<<i<<endl;
      orderbuilder.new_graph(cg);
      orderbuilder.start_new_sequence();
      if(train) {
	int j = 0;

	Expression oh = zeroes(cg, {HIDDEN_DIM});

	while(j < labels[i].size()){
	  //attention
	  Expression i_att_oh;
      	  vector<Expression> alpha_i(slen);
	  for (unsigned att = 0; att < slen; ++att){
	    alpha_i[att] = i_u * tanh(i_oh2ohxMExp * i_oh[att] + oh2ohxMExp * oh);
   	  }

  	  Expression input_cols = concatenate_cols(i_oh);
	  Expression alpha = softmax(concatenate(alpha_i));
    	  i_att_oh = transpose( transpose(alpha) * transpose( input_cols ) );
	  
	  Expression combine_h = concatenate({i_oh[i], i_att_oh});
	  oh = orderbuilder.add_input(combine_h);

          Expression i_lh = tanh(affine_transform({i_lhbias, i_oh2lh, oh}));
          Expression i_l = i_lh2l * i_lh;
	  
	  if (cor) {
	    vector<float> dist = as_vector(cg.incremental_forward());
	    double best = -9e99;
	    int bestk = -1;
            for (int k = 0; k < dist.size(); ++k) {
              if(dist[k] > best) {best = dist[k]; bestk = k; }
            }
            if (labels[i][j] == bestk) (*cor)++;
	    errs.push_back(pickneglogsoftmax(i_l, labels[i][j]));
            j += 1;
	  } 
	}
        if(predict) (*predict) += j;
        if(overall) (*overall) += labels[i].size();
      }
      else{
	int j = 0;
	
	Expression oh = zeroes(cg, {HIDDEN_DIM});

        while(j < 7) {
	  //attention
	  Expression i_att_oh;
          vector<Expression> alpha_i(slen);
          for (unsigned att = 0; att < slen; ++att){
            alpha_i[att] = i_u * tanh(i_oh2ohxMExp * i_oh[att] + oh2ohxMExp * oh);
          }

          Expression input_cols = concatenate_cols(i_oh);
          Expression alpha = softmax(concatenate(alpha_i));
          i_att_oh = transpose( transpose(alpha) * transpose( input_cols ) );

          Expression combine_h = concatenate({i_oh[i], i_att_oh});
          oh = orderbuilder.add_input(combine_h);

          Expression i_lh = tanh(affine_transform({i_lhbias, i_oh2lh, oh}));
          Expression i_l = i_lh2l * i_lh;
	  if (cor) {
	    vector<float> dist = as_vector(cg.incremental_forward());
	    double best = -9e99;
	    int bestk = -1;
	    for (int k = 0; k < dist.size(); ++k) {
	      if(dist[k] > best) {best = dist[k]; bestk = k; }
   	    }
		results[i].push_back(bestk);
	    if (j < labels[i].size() && labels[i][j] == bestk) (*cor)++;
	  
	    if (j < labels[i].size()) errs.push_back(pickneglogsoftmax(i_l, labels[i][j]));
	    else errs.push_back(pickneglogsoftmax(i_l, labels[i][labels[i].size()-1]));
	    j += 1;
	    if(bestk == endlabel) break;
	  }
       }
       if(predict) (*predict) += j;
       if(overall) (*overall) += labels[i].size();
     }
    }
//    cerr<<"errs done"<<endl;
    return sum(errs);
  }